

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall helics::Filter::Filter(Filter *this,Core *core,string_view filtName)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_R9;
  
  pcVar2 = filtName._M_str;
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_004c97b0;
  (this->super_Interface).mCore = core;
  (this->super_Interface).handle.hid = -1700000000;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_Interface).mName,pcVar2,pcVar2 + filtName._M_len);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Filter_004cb420;
  this->cloning = false;
  this->disableAssign = false;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->filtOp).super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = (*core->_vptr_Core[0x3b])(core,filtName._M_len,pcVar2,0,0,in_R9,0,0);
  (this->super_Interface).handle.hid = iVar1;
  return;
}

Assistant:

Filter::Filter(Core* core, std::string_view filtName): Interface(core, InterfaceHandle(), filtName)
{
    handle = core->registerFilter(filtName, std::string_view{}, std::string_view{});
}